

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseUnknownDataObject(XFileParser *this)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string t_1;
  int local_70;
  uint counter;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string t;
  bool running;
  XFileParser *this_local;
  
  t.field_2._M_local_buf[0xf] = '\x01';
  do {
    if ((t.field_2._M_local_buf[0xf] & 1U) == 0) break;
    GetNextToken_abi_cxx11_((string *)local_38,this);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Unexpected end of file while parsing unknown segment.",
                 &local_59);
      ThrowException(this,&local_58);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"{");
    if (bVar1) {
      local_70 = 3;
    }
    else {
      local_70 = 0;
    }
    std::__cxx11::string::~string((string *)local_38);
  } while (local_70 == 0);
  t_1.field_2._12_4_ = 1;
  while( true ) {
    if (t_1.field_2._12_4_ == 0) {
      return;
    }
    GetNextToken_abi_cxx11_((string *)local_98,this);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"{");
    if (bVar1) {
      t_1.field_2._12_4_ = t_1.field_2._12_4_ + 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"}");
      if (bVar1) {
        t_1.field_2._12_4_ = t_1.field_2._12_4_ + -1;
      }
    }
    std::__cxx11::string::~string((string *)local_98);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Unexpected end of file while parsing unknown segment.",&local_b9);
  ThrowException(this,&local_b8);
}

Assistant:

void XFileParser::ParseUnknownDataObject()
{
    // find opening delimiter
    bool running = true;
    while( running )
    {
        std::string t = GetNextToken();
        if( t.length() == 0)
            ThrowException( "Unexpected end of file while parsing unknown segment.");

        if( t == "{")
            break;
    }

    unsigned int counter = 1;

    // parse until closing delimiter
    while( counter > 0)
    {
        std::string t = GetNextToken();

        if( t.length() == 0)
            ThrowException( "Unexpected end of file while parsing unknown segment.");

        if( t == "{")
            ++counter;
        else
        if( t == "}")
            --counter;
    }
}